

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  EVP_PKEY_CTX *ctx;
  ulong uVar6;
  undefined4 in_register_0000008c;
  uint *puVar7;
  size_t x;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  uint *local_e0;
  pointer local_d8;
  EVP_PKEY_CTX *local_d0;
  SmallVector<int,_32UL> row;
  
  local_e8 = CONCAT44(in_register_0000008c,maxDistance);
  local_d0 = (EVP_PKEY_CTX *)left._M_len;
  uVar4 = right._M_len;
  SmallVector<int,_32UL>::SmallVector
            ((SmallVector<int,_32UL> *)&row.super_SmallVectorBase<int>,uVar4);
  for (local_f0 = 0; local_f0 <= (int)right._M_len; local_f0 = local_f0 + 1) {
    SmallVectorBase<int>::emplace_back<int_const&>(&row.super_SmallVectorBase<int>,&local_f0);
  }
  iVar2 = (int)local_e8;
  local_ec = iVar2 + 1;
  local_d8 = row.super_SmallVectorBase<int>.data_;
  local_e0 = (uint *)(row.super_SmallVectorBase<int>.data_ + 1);
  ctx = (EVP_PKEY_CTX *)0x1;
  do {
    if (local_d0 < ctx) {
      iVar5 = row.super_SmallVectorBase<int>.data_[uVar4];
      break;
    }
    *row.super_SmallVectorBase<int>.data_ = (int)ctx;
    uVar12 = (ulong)ctx & 0xffffffff;
    uVar6 = (ulong)ctx & 0xffffffff;
    uVar11 = (ulong)(ctx + -1) & 0xffffffff;
    uVar8 = 1;
    puVar7 = local_e0;
    while( true ) {
      if (uVar4 < uVar8) break;
      uVar1 = *puVar7;
      if (allowReplacements) {
        uVar9 = (uint)uVar11 + (uint)(left._M_str[(long)(ctx + -1)] != right._M_str[uVar8 - 1]);
        puVar3 = puVar7 + -1;
        if ((int)uVar1 < (int)uVar12) {
          puVar3 = puVar7;
        }
        uVar10 = *puVar3 + 1;
        if ((int)uVar9 <= (int)(*puVar3 + 1)) {
          uVar10 = uVar9;
        }
      }
      else {
        uVar10 = (uint)uVar11;
        if (left._M_str[(long)(ctx + -1)] != right._M_str[uVar8 - 1]) {
          puVar3 = puVar7 + -1;
          if ((int)uVar1 < (int)uVar12) {
            puVar3 = puVar7;
          }
          uVar10 = *puVar3 + 1;
        }
      }
      *puVar7 = uVar10;
      if ((int)uVar10 < (int)uVar6) {
        uVar6 = (ulong)uVar10;
      }
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 1;
      uVar12 = (ulong)uVar10;
      uVar11 = (ulong)uVar1;
    }
    ctx = ctx + 1;
  } while ((iVar2 == 0) || (iVar5 = local_ec, (int)uVar6 <= iVar2));
  SmallVectorBase<int>::cleanup(&row.super_SmallVectorBase<int>,ctx);
  return iVar5;
}

Assistant:

int editDistance(std::string_view left, std::string_view right, bool allowReplacements,
                 int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}